

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O3

void Nf_StoCreateGateMaches
               (Vec_Mem_t *vTtMem,Vec_Wec_t *vTt2Match,Mio_Cell2_t *pCell,int **pComp,int **pPerm,
               int *pnPerms,Vec_Wec_t *vProfs,Vec_Int_t *vStore,int fPinFilter,int fPinPerm,
               int fPinQuick)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  word wVar4;
  byte bVar5;
  ulong uVar6;
  word wVar7;
  ulong uTruth;
  uint uVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int Perm [6];
  
  uVar1 = *(uint *)&pCell->field_0x10;
  if (0x6fffffff < uVar1) {
    __assert_fail("pCell->nFanins <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0xff,
                  "void Nf_StoCreateGateMaches(Vec_Mem_t *, Vec_Wec_t *, Mio_Cell2_t *, int **, int **, int *, Vec_Wec_t *, Vec_Int_t *, int, int, int)"
                 );
  }
  uVar8 = uVar1 >> 0x1c;
  uVar2 = pnPerms[uVar8];
  if (0xfffffff < uVar1) {
    lVar9 = (ulong)uVar8 - 1;
    auVar10._8_4_ = (int)lVar9;
    auVar10._0_8_ = lVar9;
    auVar10._12_4_ = (int)((ulong)lVar9 >> 0x20);
    uVar6 = 0;
    auVar10 = auVar10 ^ _DAT_0093d220;
    auVar11 = _DAT_0093d210;
    do {
      auVar12 = auVar11 ^ _DAT_0093d220;
      if ((bool)(~(auVar12._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar12._0_4_ ||
                  auVar10._4_4_ < auVar12._4_4_) & 1)) {
        *(int *)((long)Perm + uVar6 * 2) = (int)uVar6;
      }
      if ((auVar12._12_4_ != auVar10._12_4_ || auVar12._8_4_ <= auVar10._8_4_) &&
          auVar12._12_4_ <= auVar10._12_4_) {
        *(int *)((long)Perm + uVar6 * 2 + 4) = (int)uVar6 + 2;
      }
      lVar9 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar9 + 2;
      uVar6 = uVar6 + 4;
    } while ((uVar8 * 2 + 2 & 0x1c) != uVar6);
  }
  if (0 < (int)uVar2) {
    wVar4 = pCell->uTruth;
    uVar6 = 0;
    wVar7 = wVar4;
    uVar8 = uVar1;
    do {
      lVar9 = 0;
      uTruth = wVar7;
      do {
        Nf_StoCreateGateAdd(vTtMem,vTt2Match,pCell,uTruth,Perm,uVar8 >> 0x1c,vProfs,vStore,
                            fPinFilter,fPinPerm,fPinQuick);
        uVar8 = *(uint *)&pCell->field_0x10;
        iVar3 = pComp[uVar8 >> 0x1c][lVar9];
        if (Perm[iVar3] < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x131,"int Abc_LitNot(int)");
        }
        bVar5 = (byte)(1 << ((byte)iVar3 & 0x1f));
        uTruth = uTruth << (bVar5 & 0x3f) & s_Truths6[iVar3] |
                 (s_Truths6[iVar3] & uTruth) >> (bVar5 & 0x3f);
        Perm[iVar3] = Perm[iVar3] ^ 1;
        lVar9 = lVar9 + 1;
      } while ((uint)lVar9 >> (byte)(uVar1 >> 0x1c) == 0);
      if (wVar7 != uTruth) {
        __assert_fail("tTemp2 == tCur",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                      ,0x10e,
                      "void Nf_StoCreateGateMaches(Vec_Mem_t *, Vec_Wec_t *, Mio_Cell2_t *, int **, int **, int *, Vec_Wec_t *, Vec_Int_t *, int, int, int)"
                     );
      }
      if (uVar2 != 1) {
        iVar3 = pPerm[uVar8 >> 0x1c][uVar6];
        bVar5 = (byte)(1L << ((byte)iVar3 & 0x3f));
        wVar7 = (wVar7 & s_PMasks[iVar3][2]) >> (bVar5 & 0x3f) |
                (s_PMasks[iVar3][1] & wVar7) << (bVar5 & 0x3f) | s_PMasks[iVar3][0] & wVar7;
        *(ulong *)(Perm + iVar3) =
             CONCAT44((int)*(undefined8 *)(Perm + iVar3),
                      (int)((ulong)*(undefined8 *)(Perm + iVar3) >> 0x20));
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar2);
    if (wVar4 != wVar7) {
      __assert_fail("tTemp1 == tCur",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                    ,0x117,
                    "void Nf_StoCreateGateMaches(Vec_Mem_t *, Vec_Wec_t *, Mio_Cell2_t *, int **, int **, int *, Vec_Wec_t *, Vec_Int_t *, int, int, int)"
                   );
    }
  }
  return;
}

Assistant:

void Nf_StoCreateGateMaches( Vec_Mem_t * vTtMem, Vec_Wec_t * vTt2Match, Mio_Cell2_t * pCell, int ** pComp, int ** pPerm, int * pnPerms, Vec_Wec_t * vProfs, Vec_Int_t * vStore, int fPinFilter, int fPinPerm, int fPinQuick )
{
    int Perm[NF_LEAF_MAX], * Perm1, * Perm2;
    int nPerms = pnPerms[pCell->nFanins];
    int nMints = (1 << pCell->nFanins);
    word tCur, tTemp1, tTemp2;
    int i, p, c;
    assert( pCell->nFanins <= 6 );
    for ( i = 0; i < (int)pCell->nFanins; i++ )
        Perm[i] = Abc_Var2Lit( i, 0 );
    tCur = tTemp1 = pCell->uTruth;
    for ( p = 0; p < nPerms; p++ )
    {
        tTemp2 = tCur;
        for ( c = 0; c < nMints; c++ )
        {
            Nf_StoCreateGateAdd( vTtMem, vTt2Match, pCell, tCur, Perm, pCell->nFanins, vProfs, vStore, fPinFilter, fPinPerm, fPinQuick );
            // update
            tCur  = Abc_Tt6Flip( tCur, pComp[pCell->nFanins][c] );
            Perm1 = Perm + pComp[pCell->nFanins][c];
            *Perm1 = Abc_LitNot( *Perm1 );
        }
        assert( tTemp2 == tCur );
        if ( nPerms == 1 )
            continue;
        // update
        tCur = Abc_Tt6SwapAdjacent( tCur, pPerm[pCell->nFanins][p] );
        Perm1 = Perm + pPerm[pCell->nFanins][p];
        Perm2 = Perm1 + 1;
        ABC_SWAP( int, *Perm1, *Perm2 );
    }
    assert( tTemp1 == tCur );
}